

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
duckdb_re2::Prog::EmitList
          (Prog *this,int root,SparseArray<int> *rootmap,
          vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_> *flat,
          SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  pointer piVar1;
  Inst *pIVar2;
  pointer pIVar3;
  bool bVar4;
  int iVar5;
  uint i;
  uint local_54;
  SparseArray<int> *local_50;
  anon_union_4_5_a14c903b_for_Inst_2 local_44;
  vector<int,_std::allocator<int>_> *local_40;
  Prog *local_38;
  uint uVar6;
  
  reachable->size_ = 0;
  piVar1 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  local_54 = root;
  local_50 = rootmap;
  local_40 = stk;
  local_38 = this;
  std::vector<int,_std::allocator<int>_>::push_back(stk,(value_type_conflict *)&local_54);
LAB_00eb0cb6:
  do {
    piVar1 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar1) {
      return;
    }
    i = piVar1[-1];
    (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1 + -1;
    while( true ) {
      bVar4 = SparseSetT<void>::contains(reachable,i);
      if (bVar4) break;
      SparseSetT<void>::insert_new(reachable,i);
      if (i != local_54) {
        bVar4 = SparseArray<int>::has_index(local_50,i);
        if (bVar4) {
          std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
          emplace_back<>(flat);
          pIVar3 = (flat->
                   super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          uVar6 = pIVar3[-1].out_opcode_;
          pIVar3[-1].out_opcode_ = uVar6 & 0xfffffff8 | 6;
          pIVar3[-1].out_opcode_ =
               uVar6 & 8 | 6 |
               (local_50->dense_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
               _M_head_impl
               [(local_50->sparse_).ptr_._M_t.
                super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i]].value_ << 4;
          break;
        }
      }
      pIVar2 = (local_38->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      uVar6 = pIVar2[(int)i].out_opcode_;
      switch(uVar6 & 7) {
      case 1:
        std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::emplace_back<>
                  (flat);
        pIVar3 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        iVar5 = (int)((ulong)((long)pIVar3 -
                             (long)(flat->
                                   super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3);
        pIVar3[-1].out_opcode_ = (pIVar3[-1].out_opcode_ & 8) + iVar5 * 0x10 + 1;
        pIVar3[-1].field_1.out1_ = iVar5 + 1;
      case 0:
        local_44 = pIVar2[(int)i].field_1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_40,&local_44.cap_);
        uVar6 = pIVar2[(int)i].out_opcode_;
      case 6:
        i = uVar6 >> 4;
        break;
      default:
        std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::emplace_back<>
                  (flat);
        (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
        _M_impl.super__Vector_impl_data._M_finish[-1] = pIVar2[(int)i];
        pIVar3 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pIVar3[-1].out_opcode_ =
             pIVar3[-1].out_opcode_ & 0xf |
             (local_50->dense_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
             [(local_50->sparse_).ptr_._M_t.
              super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
              super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl[pIVar2[(int)i].out_opcode_ >> 4]].
             value_ << 4;
        goto LAB_00eb0cb6;
      case 5:
      case 7:
        std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::emplace_back<>
                  (flat);
        (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
        _M_impl.super__Vector_impl_data._M_finish[-1] = pIVar2[(int)i];
        goto LAB_00eb0cb6;
      }
    }
  } while( true );
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap,
                    std::vector<Inst>* flat,
                    SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32_t>(flat->size())+1;
        FALLTHROUGH_INTENDED;

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}